

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall
leveldb::TableBuilder::WriteBlock(TableBuilder *this,BlockBuilder *block,BlockHandle *handle)

{
  long lVar1;
  bool bVar2;
  Slice *this_00;
  size_t sVar3;
  TableBuilder *in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  string *compressed;
  CompressionType type;
  Rep *r;
  Slice block_contents;
  Slice raw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  BlockBuilder *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  TableBuilder *in_stack_ffffffffffffff80;
  BlockBuilder *in_stack_ffffffffffffff98;
  CompressionType type_00;
  Slice *block_contents_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ok(in_stack_ffffffffffffff80);
  if (!bVar2) {
    __assert_fail("ok()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x92,"void leveldb::TableBuilder::WriteBlock(BlockBuilder *, BlockHandle *)");
  }
  block_contents_00 = (Slice *)*in_RDI;
  BlockBuilder::Finish(in_stack_ffffffffffffff98);
  Slice::Slice((Slice *)in_stack_ffffffffffffff68);
  type_00 = *(CompressionType *)&block_contents_00[5].data_;
  if ((type_00 != kNoCompression) && (type_00 == kSnappyCompression)) {
    in_stack_ffffffffffffff98 = (BlockBuilder *)&block_contents_00[0x1f].size_;
    Slice::data((Slice *)in_stack_ffffffffffffff68);
    Slice::size((Slice *)in_stack_ffffffffffffff68);
    bVar2 = port::Snappy_Compress
                      (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
                       in_stack_ffffffffffffff68);
    if (bVar2) {
      this_00 = (Slice *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                   (in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff70 = (BlockBuilder *)Slice::size((Slice *)in_stack_ffffffffffffff68);
      sVar3 = Slice::size((Slice *)in_stack_ffffffffffffff68);
      if (this_00 < (Slice *)((long)in_stack_ffffffffffffff70 - (sVar3 >> 3))) {
        Slice::Slice(this_00,(string *)in_stack_ffffffffffffff70);
        goto LAB_00d46d20;
      }
    }
    type_00 = kNoCompression;
  }
LAB_00d46d20:
  WriteRawBlock(in_RDX,block_contents_00,type_00,(BlockHandle *)in_stack_ffffffffffffff98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (in_stack_ffffffffffffff68);
  BlockBuilder::Reset(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TableBuilder::WriteBlock(BlockBuilder* block, BlockHandle* handle) {
  // File format contains a sequence of blocks where each block has:
  //    block_data: uint8[n]
  //    type: uint8
  //    crc: uint32
  assert(ok());
  Rep* r = rep_;
  Slice raw = block->Finish();

  Slice block_contents;
  CompressionType type = r->options.compression;
  // TODO(postrelease): Support more compression options: zlib?
  switch (type) {
    case kNoCompression:
      block_contents = raw;
      break;

    case kSnappyCompression: {
      std::string* compressed = &r->compressed_output;
      if (port::Snappy_Compress(raw.data(), raw.size(), compressed) &&
          compressed->size() < raw.size() - (raw.size() / 8u)) {
        block_contents = *compressed;
      } else {
        // Snappy not supported, or compressed less than 12.5%, so just
        // store uncompressed form
        block_contents = raw;
        type = kNoCompression;
      }
      break;
    }
  }
  WriteRawBlock(block_contents, type, handle);
  r->compressed_output.clear();
  block->Reset();
}